

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFillBufferTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_0::UpdateBufferTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UpdateBufferTestInstance *this)

{
  VkCommandBuffer_s *pVVar1;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> data;
  VkResult VVar2;
  TextureLevel *pTVar3;
  Allocation *pAVar4;
  DeviceInterface *vkd;
  VkDevice device;
  Handle<(vk::HandleType)8> *pHVar5;
  VkCommandBuffer_s **ppVVar6;
  Handle<(vk::HandleType)6> *pHVar7;
  TextureLevel *this_00;
  TextureFormat *format;
  VkDeviceSize VVar8;
  IVec3 *size;
  void *data_00;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *this_01;
  Move<vk::Handle<(vk::HandleType)8>_> *this_02;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  Move<vk::Handle<(vk::HandleType)6>_> *this_04;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *this_05;
  undefined8 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  ConstPixelBufferAccess local_290;
  ConstPixelBufferAccess local_268;
  TextureFormat local_240;
  ConstPixelBufferAccess local_238;
  PixelBufferAccess local_210;
  VkDeviceMemory local_1e8;
  DefaultDeleter<tcu::TextureLevel> local_1d9;
  ConstPixelBufferAccess local_1d8;
  undefined1 local_1b0 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultLevel;
  undefined8 uStack_198;
  VkSubmitInfo submitInfo;
  undefined8 uStack_148;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined4 local_120 [2];
  VkBufferMemoryBarrier dstBufferBarrier;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  ConstPixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  DefaultDeleter<tcu::TextureLevel> local_55 [13];
  TextureFormat local_48;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_40;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *local_30;
  int local_1c;
  UpdateBufferTestInstance *pUStack_18;
  int dstLevelWidth;
  UpdateBufferTestInstance *this_local;
  
  local_1c = (int)((this->super_FillBufferTestInstance).m_params.dstSize >> 2);
  pUStack_18 = this;
  this_local = (UpdateBufferTestInstance *)__return_storage_ptr__;
  pTVar3 = (TextureLevel *)operator_new(0x28);
  local_48 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UINT);
  tcu::TextureLevel::TextureLevel(pTVar3,&local_48,local_1c,1,1);
  de::DefaultDeleter<tcu::TextureLevel>::DefaultDeleter(local_55);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr();
  local_30 = de::details::MovePtr::operator_cast_to_PtrData(&local_40,(MovePtr *)pTVar3);
  data._8_4_ = in_stack_fffffffffffffc50;
  data.ptr = (TextureLevel *)in_stack_fffffffffffffc48;
  data._12_4_ = in_stack_fffffffffffffc54;
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::operator=
            (&(this->super_FillBufferTestInstance).m_destinationTextureLevel,data);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_40);
  this_01 = &(this->super_FillBufferTestInstance).m_destinationTextureLevel;
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->(&this_01->
                       super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  tcu::TextureLevel::getAccess(&local_80,pTVar3);
  FillBufferTestInstance::generateBuffer(&this->super_FillBufferTestInstance,&local_80,local_1c,1,1)
  ;
  (*(this->super_FillBufferTestInstance).super_TestInstance._vptr_TestInstance[3])();
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->(&this_01->
                       super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&vk,pTVar3);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_a8,(ConstPixelBufferAccess *)&vk);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator*
                     (&(this->super_FillBufferTestInstance).m_destinationBufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  FillBufferTestInstance::uploadBuffer(&this->super_FillBufferTestInstance,&local_a8,pAVar4);
  vkd = Context::getDeviceInterface
                  ((this->super_FillBufferTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_FillBufferTestInstance).super_TestInstance.m_context);
  dstBufferBarrier.size =
       (VkDeviceSize)
       Context::getUniversalQueue((this->super_FillBufferTestInstance).super_TestInstance.m_context)
  ;
  local_120[0] = 0x2c;
  dstBufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  dstBufferBarrier._4_4_ = 0;
  dstBufferBarrier.pNext._0_4_ = 0x1000;
  dstBufferBarrier.pNext._4_4_ = 0x2000;
  dstBufferBarrier.srcAccessMask = 0xffffffff;
  dstBufferBarrier.dstAccessMask = 0xffffffff;
  this_02 = &(this->super_FillBufferTestInstance).m_destination;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&this_02->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dstBufferBarrier._24_8_ = pHVar5->m_internal;
  dstBufferBarrier.buffer.m_internal = 0;
  dstBufferBarrier.offset = (this->super_FillBufferTestInstance).m_params.dstOffset;
  cmdBufferBeginInfo.pNext = (void *)0x1;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  uStack_148 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  this_03 = &(this->super_FillBufferTestInstance).m_cmdBuffer;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar2 = (*vkd->_vptr_DeviceInterface[0x49])(vkd,*ppVVar6,&uStack_148);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x13c);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar6;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&this_02->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  submitInfo.pSignalSemaphores = (VkSemaphore *)pHVar5->m_internal;
  (*vkd->_vptr_DeviceInterface[100])
            (vkd,pVVar1,submitInfo.pSignalSemaphores,
             (this->super_FillBufferTestInstance).m_params.dstOffset,
             (this->super_FillBufferTestInstance).m_params.size,
             (this->super_FillBufferTestInstance).m_params.testData);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vkd->_vptr_DeviceInterface[0x6d])(vkd,*ppVVar6,0x1000,1,0,0,0,1,local_120,0,0);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar2 = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,*ppVVar6);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x13f);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_198 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  this_04 = &(this->super_FillBufferTestInstance).m_fence;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     (&this_04->super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*vkd->_vptr_DeviceInterface[0x14])(vkd,device,1,pHVar7);
  ::vk::checkResult(VVar2,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x14e);
  VVar8 = dstBufferBarrier.size;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     (&this_04->super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  resultLevel.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
  _8_8_ = pHVar7->m_internal;
  VVar2 = (*vkd->_vptr_DeviceInterface[2])
                    (vkd,VVar8,1,&uStack_198,
                     resultLevel.
                     super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                     m_data._8_8_);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x14f);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     (&this_04->super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*vkd->_vptr_DeviceInterface[0x16])(vkd,device,1,pHVar7,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x150);
  pTVar3 = (TextureLevel *)operator_new(0x28);
  this_00 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
            operator->(&this_01->
                        super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>)
  ;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_1d8,this_00);
  format = tcu::ConstPixelBufferAccess::getFormat(&local_1d8);
  tcu::TextureLevel::TextureLevel(pTVar3,format,local_1c,1,1);
  de::DefaultDeleter<tcu::TextureLevel>::DefaultDeleter(&local_1d9);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_1b0,pTVar3)
  ;
  this_05 = &(this->super_FillBufferTestInstance).m_destinationBufferAlloc;
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&this_05->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  local_1e8 = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&this_05->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar8 = ::vk::Allocation::getOffset(pAVar4);
  ::vk::invalidateMappedMemoryRange
            (vkd,device,local_1e8,VVar8,(this->super_FillBufferTestInstance).m_params.dstOffset);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator*((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                     local_1b0);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_210,pTVar3);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_1b0);
  local_240 = tcu::TextureLevel::getFormat(pTVar3);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_1b0);
  size = tcu::TextureLevel::getSize(pTVar3);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->super_FillBufferTestInstance).m_destinationBufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  data_00 = ::vk::Allocation::getHostPtr(pAVar4);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_238,&local_240,size,data_00);
  tcu::copy((EVP_PKEY_CTX *)&local_210,(EVP_PKEY_CTX *)&local_238);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_1b0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_290,pTVar3);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_268,&local_290);
  (*(this->super_FillBufferTestInstance).super_TestInstance._vptr_TestInstance[4])
            (__return_storage_ptr__,this,&local_268);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus UpdateBufferTestInstance::iterate (void)
{
	const int	dstLevelWidth		= (int)(m_params.dstSize / 4);
	m_destinationTextureLevel		= de::MovePtr<tcu::TextureLevel>(new tcu::TextureLevel(mapVkFormat(VK_FORMAT_R8G8B8A8_UINT), dstLevelWidth, 1));

	generateBuffer(m_destinationTextureLevel->getAccess(), dstLevelWidth, 1, 1);

	generateExpectedResult();

	uploadBuffer(m_destinationTextureLevel->getAccess(), *m_destinationBufferAlloc);

	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();

	const VkBufferMemoryBarrier		dstBufferBarrier	=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*m_destination,								// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		m_params.dstOffset							// VkDeviceSize		size;
	};

	const VkCommandBufferBeginInfo	cmdBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdUpdateBuffer(*m_cmdBuffer, *m_destination, m_params.dstOffset, m_params.size, m_params.testData);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &dstBufferBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	const VkSubmitInfo				submitInfo			=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	// Read buffer data
	de::MovePtr<tcu::TextureLevel>	resultLevel	(new tcu::TextureLevel(m_destinationTextureLevel->getAccess().getFormat(), dstLevelWidth, 1));
	invalidateMappedMemoryRange(vk, vkDevice, m_destinationBufferAlloc->getMemory(), m_destinationBufferAlloc->getOffset(), m_params.dstOffset);
	tcu::copy(*resultLevel, tcu::ConstPixelBufferAccess(resultLevel->getFormat(), resultLevel->getSize(), m_destinationBufferAlloc->getHostPtr()));

	return checkTestResult(resultLevel->getAccess());
}